

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int INT_CMwrite_raw_notify
              (CMConnection conn,FFSEncodeVector full_vec,FFSEncodeVector data_vec,long vec_count,
              size_t byte_count,attr_list attrs,int data_vec_stack,
              CMcompletion_notify_func notify_func,void *notify_client_data)

{
  undefined8 *puVar1;
  transport_entry_conflict p_Var2;
  FFSEncodeVector pFVar3;
  FILE *pFVar4;
  uint uVar5;
  int iVar6;
  __pid_t _Var7;
  size_t *psVar8;
  ulong uVar9;
  CMbuffer p_Var10;
  FFSEncodeVector pFVar11;
  pthread_t pVar12;
  char cVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  timespec ts;
  timespec local_48;
  long local_38;
  
  if (conn->closed != 0) {
    return 0;
  }
  if (conn->failed != 0) {
    return 0;
  }
  if (conn->write_pending != 0) {
    wait_for_pending_write(conn);
  }
  if (vec_count < 1) {
    uVar22 = 0;
    cVar13 = '\0';
  }
  else {
    psVar8 = &full_vec->iov_len;
    uVar22 = 0;
    lVar14 = vec_count;
    do {
      uVar22 = uVar22 + *psVar8;
      psVar8 = psVar8 + 2;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
    cVar13 = '\0';
    if (uVar22 < 0x2800 && 0 < vec_count) {
      uVar16 = 4;
      lVar14 = 0;
      cVar13 = '\0';
      do {
        if (uVar16 < full_vec[lVar14].iov_len) {
          do {
            cVar13 = cVar13 + *(char *)((long)full_vec[lVar14].iov_base + uVar16);
            uVar16 = uVar16 + 1;
          } while (full_vec[lVar14].iov_len != uVar16);
        }
        lVar14 = lVar14 + 1;
        uVar16 = 0;
      } while (lVar14 != vec_count);
    }
  }
  *(char *)full_vec->iov_base = cVar13;
  p_Var2 = conn->trans;
  if ((conn->do_non_blocking_write != 1) || (p_Var2->NBwritev_func == (CMTransport_writev_func)0x0))
  {
    if (notify_func == (CMcompletion_notify_func)0x0 ||
        p_Var2->writev_complete_notify_func == (CMTransport_writev_complete_notify_func)0x0) {
      iVar6 = (*p_Var2->writev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs);
      if (iVar6 == 0) {
        iVar23 = CMtrace_val[7];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar23 = CMtrace_init(conn->cm,CMFreeVerbose);
        }
        if (iVar23 != 0) {
          if (CMtrace_PID != 0) {
            pFVar4 = (FILE *)conn->cm->CMTrace_file;
            _Var7 = getpid();
            pVar12 = pthread_self();
            fprintf(pFVar4,"P%lxT%lx - ",(long)_Var7,pVar12);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec)
            ;
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "Calling write failed connection failed with dereference %p\n",conn);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        INT_CMConnection_failed(conn);
      }
      lVar14 = (long)iVar6;
      if (notify_func != (CMcompletion_notify_func)0x0) {
        (*notify_func)(notify_client_data);
      }
    }
    else {
      iVar6 = (*p_Var2->writev_complete_notify_func)
                        (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs,
                         notify_func,notify_client_data);
      lVar14 = (long)iVar6;
    }
LAB_0011fd2e:
    return (uint)(lVar14 == vec_count);
  }
  uVar5 = (*p_Var2->NBwritev_func)
                    (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs);
  if ((int)uVar5 < 0) {
    iVar6 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar6 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar6 != 0) {
      if (CMtrace_PID != 0) {
        pFVar4 = (FILE *)conn->cm->CMTrace_file;
        _Var7 = getpid();
        local_38 = (long)_Var7;
        pthread_self();
        fprintf(pFVar4,"P%lxT%lx - ",local_38);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "Calling write failed connection failed with dereference %p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMConnection_failed(conn);
    p_Var10 = (conn->queued_data).buffer_to_free;
    if (p_Var10 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var10);
      (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
    cm_wake_any_pending_write(conn);
  }
  lVar14 = vec_count;
  if ((long)uVar22 <= (long)(int)uVar5) goto LAB_0011fd2e;
  uVar16 = 0;
  if (0 < (int)uVar5) {
    uVar16 = (ulong)uVar5;
  }
  if (data_vec_stack != 0) {
    data_vec = (FFSEncodeVector)copy_vector_to_FFSBuffer(conn->io_out_buffer,data_vec);
  }
  uVar21 = 0;
  uVar5 = (uint)vec_count;
  if ((int)uVar5 < 1) {
    lVar14 = 0;
  }
  else {
    uVar9 = (ulong)(uVar5 & 0x7fffffff);
    psVar8 = &full_vec->iov_len;
    lVar14 = 0;
    do {
      lVar14 = lVar14 + *psVar8;
      psVar8 = psVar8 + 2;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  uVar9 = full_vec->iov_len;
  pFVar11 = full_vec;
  uVar20 = uVar16;
  if (uVar9 < uVar16) {
    lVar15 = 0;
    do {
      uVar20 = uVar20 - uVar9;
      lVar15 = lVar15 + 1;
      uVar9 = pFVar11[1].iov_len;
      pFVar11 = pFVar11 + 1;
    } while (uVar9 < uVar20);
    uVar21 = (uint)lVar15;
  }
  else {
    lVar15 = 0;
  }
  pFVar11->iov_len = uVar9 - uVar20;
  pFVar11->iov_base = (void *)((long)pFVar11->iov_base + uVar20);
  if (data_vec != (FFSEncodeVector)0x0) {
    sVar18 = pFVar11->iov_len;
    puVar1 = (undefined8 *)
             ((long)&data_vec[lVar15].iov_base +
             ((ulong)(attrs == (attr_list)0x0) << 4 | 0xffffffffffffffe0));
    *puVar1 = pFVar11->iov_base;
    puVar1[1] = sVar18;
  }
  (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
  if (uVar21 == 0) {
    if (0x20 < full_vec->iov_len) {
      __assert_fail("sizeof(conn->queued_data.rem_header) >= tmp_vec[0].iov_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xbae,
                    "void queue_remaining_write(CMConnection, FFSEncodeVector, FFSEncodeVector, int, attr_list, size_t, int)"
                   );
    }
    memcpy(&conn->queued_data,full_vec->iov_base,full_vec->iov_len);
    sVar18 = full_vec->iov_len;
  }
  else {
    sVar18 = 0;
  }
  (conn->queued_data).rem_header_len = sVar18;
  pFVar11 = (FFSEncodeVector)0x0;
  if (uVar21 < 2 && attrs != (attr_list)0x0) {
    (conn->queued_data).rem_attr_base = (char *)full_vec[1].iov_base;
    sVar17 = full_vec[1].iov_len;
    uVar21 = uVar21 + 1;
  }
  else {
    sVar17 = 0;
  }
  (conn->queued_data).rem_attr_len = sVar17;
  uVar19 = ((attrs == (attr_list)0x0) - 2) + uVar21;
  if (uVar19 != 0xffffffff) {
    if (data_vec == (FFSEncodeVector)0x0) {
      sVar18 = lVar14 - (sVar18 + uVar16 + sVar17);
      p_Var10 = cm_get_data_buf(conn->cm,sVar18 + 0x20);
      pFVar3 = (FFSEncodeVector)p_Var10->buffer;
      pFVar11 = pFVar3 + 2;
      iVar23 = uVar21 + (uVar21 == 0);
      iVar6 = 2;
      if (2 < iVar23) {
        iVar6 = iVar23;
      }
      pFVar3->iov_len = sVar18;
      pFVar3->iov_base = pFVar11;
      pFVar3[1].iov_base = (void *)0x0;
      pFVar3[1].iov_len = 0;
      (conn->queued_data).buffer_to_free = p_Var10;
      (conn->queued_data).vector_data = pFVar3;
      if (attrs == (attr_list)0x0) {
        iVar6 = iVar23;
      }
      if (iVar6 < (int)uVar5) {
        lVar14 = (long)(int)uVar5 - (long)iVar6;
        psVar8 = &full_vec[iVar6].iov_len;
        do {
          memcpy(pFVar11,((FFSEncodeVec *)(psVar8 + -1))->iov_base,*psVar8);
          pFVar11 = (FFSEncodeVector)((long)&pFVar11->iov_base + *psVar8);
          psVar8 = psVar8 + 2;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      goto LAB_00120035;
    }
    (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    if ((int)uVar19 < 0) {
      uVar9 = 0;
    }
    else {
      iVar6 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar6 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar6 != 0) {
        if (CMtrace_PID != 0) {
          pFVar4 = (FILE *)conn->cm->CMTrace_file;
          _Var7 = getpid();
          pVar12 = pthread_self();
          fprintf(pFVar4,"P%lxT%lx - ",(long)_Var7,pVar12);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,"Removing from pbio_vec at offset %d\n",(ulong)uVar19
               );
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      uVar9 = (ulong)uVar19;
    }
    pFVar11 = (FFSEncodeVector)copy_all_to_FFSBuffer(conn->io_out_buffer,data_vec + uVar9);
  }
  (conn->queued_data).vector_data = pFVar11;
LAB_00120035:
  (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,1);
  conn->write_pending = 1;
  iVar6 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar6 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar6 != 0) {
    if (CMtrace_PID != 0) {
      pFVar4 = (FILE *)conn->cm->CMTrace_file;
      _Var7 = getpid();
      pVar12 = pthread_self();
      fprintf(pFVar4,"P%lxT%lx - ",(long)_Var7,pVar12);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_48);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"Partial write, queued %zd bytes\n",uVar22 - uVar16);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  return 1;
}

Assistant:

int
 INT_CMwrite_raw_notify(CMConnection conn, FFSEncodeVector full_vec, FFSEncodeVector data_vec,
			long vec_count, size_t byte_count, attr_list attrs, int data_vec_stack,
			CMcompletion_notify_func notify_func, void *notify_client_data)
 {
     size_t actual = 0;
     unsigned char checksum = 0;
     int i, j, start;
     size_t count = 0;
     size_t length = 0;
     if (conn->closed || conn->failed) return 0;

     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     for (i=0; i < vec_count; i++) {
	 length += full_vec[i].iov_len;
     }
     start = 4;
     if (length < 10240) {
	 /* do checksum for small messages */
	 for (i=0; i < vec_count; i++) {
	     count += full_vec[i].iov_len - start;
	     for (j=start; j< full_vec[i].iov_len; j++) {
		 checksum += ((unsigned char*)full_vec[i].iov_base)[j];
	     }
	     start = 0;
	 }
     }
     ((int*)full_vec[0].iov_base)[0] = 
	 (((int*)full_vec[0].iov_base)[0] & 0xffffff00) | (unsigned char) checksum;
     if ((conn->do_non_blocking_write == 1) && (conn->trans->NBwritev_func)) {
	 ssize_t actual_bytes;
	 actual_bytes = 
	     conn->trans->NBwritev_func(&CMstatic_trans_svcs, 
					     conn->transport_data, 
					     full_vec, vec_count, attrs);
	 if (actual_bytes < 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     if (conn->queued_data.buffer_to_free) {
		 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
		 conn->queued_data.buffer_to_free = NULL;
	     }
	     conn->write_pending = 0;
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
					   conn->transport_data, 0);
	     cm_wake_any_pending_write(conn);
	 }
	 if (actual_bytes < (ssize_t)length) {
	     /* copy remaining and send it later */
	     if (actual_bytes < 0 ) actual_bytes = 0;
	     if (data_vec_stack) {
		 data_vec = copy_vector_to_FFSBuffer(conn->io_out_buffer, data_vec);
	     }
	     queue_remaining_write(conn, full_vec, data_vec, vec_count, 
				   attrs, actual_bytes, attrs != NULL);
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, conn->transport_data, 1);
	     conn->write_pending = 1;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Partial write, queued %zd bytes\n",
			 length - actual_bytes);
	     return 1;
	 }
	 actual = vec_count;  /* set actual for success */
     } else if (conn->trans->writev_complete_notify_func && notify_func) {
	 actual = conn->trans->writev_complete_notify_func(&CMstatic_trans_svcs, 
							   conn->transport_data, 
							   full_vec, vec_count, 
							   attrs, notify_func, notify_client_data);
     } else {
	 actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
					   conn->transport_data, 
					   full_vec, vec_count, attrs);
	 if (actual <= 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	 }
	 if (notify_func) {
	     (notify_func)(notify_client_data);
	 }
     }
     return actual == vec_count ? 1 : 0;
 }